

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O3

TestNode * __thiscall xe::TestGroup::findChildNode(TestGroup *this,char *path)

{
  char cVar1;
  pointer ppTVar2;
  pointer pcVar3;
  vector<xe::TestNode_*,_std::allocator<xe::TestNode_*>_> *pvVar4;
  Error *this_00;
  int compLen;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  do {
    uVar6 = 0;
    while( true ) {
      iVar5 = (int)uVar6;
      cVar1 = path[iVar5];
      if ((cVar1 == '\0') || (cVar1 == '.')) break;
      uVar6 = (ulong)(iVar5 + 1);
    }
    if (iVar5 < 1) {
      this_00 = (Error *)__cxa_allocate_exception(0x10);
      Error::Error(this_00,(char *)0x0,"compLen > 0",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/executor/xeTestCase.cpp"
                   ,0xce);
      __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
    }
    ppTVar2 = (this->m_children).super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pvVar4 = &this->m_children;
    while( true ) {
      if (ppTVar2 ==
          (pvVar4->super__Vector_base<xe::TestNode_*,_std::allocator<xe::TestNode_*>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        return (TestNode *)0x0;
      }
      this = (TestGroup *)*ppTVar2;
      pcVar3 = (this->super_TestNode).m_name._M_dataplus._M_p;
      uVar7 = 0;
      do {
        if (pcVar3[uVar7] != path[uVar7]) goto LAB_0011d3d8;
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
      if (pcVar3[iVar5] == '\0') break;
LAB_0011d3d8:
      ppTVar2 = ppTVar2 + 1;
    }
    if (this == (TestGroup *)0x0) {
      return (TestNode *)0x0;
    }
    if (cVar1 == '\0') {
      return &this->super_TestNode;
    }
    path = path + uVar6 + 1;
    if ((this->super_TestNode).m_nodeType != TESTNODETYPE_GROUP) {
      return (TestNode *)0x0;
    }
  } while( true );
}

Assistant:

const TestNode* TestGroup::findChildNode (const char* path) const
{
	int compLen = getFirstComponentLength(path);
	XE_CHECK(compLen > 0);

	// Try to find matching children.
	const TestNode* matchingNode = DE_NULL;
	for (vector<TestNode*>::const_iterator iter = m_children.begin(); iter != m_children.end(); iter++)
	{
		if (compareNameToPathComponent((*iter)->getName(), path, compLen))
		{
			matchingNode = *iter;
			break;
		}
	}

	if (matchingNode)
	{
		if (path[compLen] == 0)
			return matchingNode; // Last element in path, return matching node.
		else if (matchingNode->getNodeType() == TESTNODETYPE_GROUP)
			return static_cast<const TestGroup*>(matchingNode)->findChildNode(path + compLen + 1);
		else
			return DE_NULL;
	}
	else
		return DE_NULL;
}